

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UaPdu.cpp
# Opt level: O2

void __thiscall DIS::UaPdu::marshal(UaPdu *this,DataStream *dataStream)

{
  pointer pVVar1;
  size_t idx;
  ulong uVar2;
  size_t idx_1;
  long lVar3;
  Vector3Float x;
  
  DistributedEmissionsFamilyPdu::marshal(&this->super_DistributedEmissionsFamilyPdu,dataStream);
  EntityID::marshal(&this->_emittingEntityID,dataStream);
  EventIdentifier::marshal(&this->_eventID,dataStream);
  DataStream::operator<<(dataStream,this->_stateChangeIndicator);
  DataStream::operator<<(dataStream,this->_pad);
  DataStream::operator<<(dataStream,this->_passiveParameterIndex);
  DataStream::operator<<(dataStream,this->_propulsionPlantConfiguration);
  DataStream::operator<<
            (dataStream,
             (uchar)(((long)(this->_shaftRPMs).
                            super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->_shaftRPMs).
                           super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x18));
  DataStream::operator<<
            (dataStream,
             (uchar)(((long)(this->_apaData).
                            super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->_apaData).
                           super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x18));
  DataStream::operator<<
            (dataStream,
             (uchar)(((long)(this->_emitterSystems).
                            super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->_emitterSystems).
                           super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x18));
  lVar3 = 8;
  uVar2 = 0;
  while( true ) {
    pVVar1 = (this->_shaftRPMs).
             super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_shaftRPMs).
                       super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) / 0x18) <= uVar2)
    break;
    x._vptr_Vector3Float = (_func_int **)&PTR__Vector3Float_001c3790;
    x._z = *(float *)((long)&pVVar1->_x + lVar3);
    x._8_8_ = *(undefined8 *)((long)&pVVar1->_vptr_Vector3Float + lVar3);
    Vector3Float::marshal(&x,dataStream);
    Vector3Float::~Vector3Float(&x);
    uVar2 = uVar2 + 1;
    lVar3 = lVar3 + 0x18;
  }
  lVar3 = 8;
  uVar2 = 0;
  while( true ) {
    pVVar1 = (this->_apaData).
             super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_apaData).
                       super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) / 0x18) <= uVar2)
    break;
    x._vptr_Vector3Float = (_func_int **)&PTR__Vector3Float_001c3790;
    x._z = *(float *)((long)&pVVar1->_x + lVar3);
    x._8_8_ = *(undefined8 *)((long)&pVVar1->_vptr_Vector3Float + lVar3);
    Vector3Float::marshal(&x,dataStream);
    Vector3Float::~Vector3Float(&x);
    uVar2 = uVar2 + 1;
    lVar3 = lVar3 + 0x18;
  }
  lVar3 = 8;
  uVar2 = 0;
  while( true ) {
    pVVar1 = (this->_emitterSystems).
             super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_emitterSystems).
                       super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) / 0x18) <= uVar2)
    break;
    x._vptr_Vector3Float = (_func_int **)&PTR__Vector3Float_001c3790;
    x._z = *(float *)((long)&pVVar1->_x + lVar3);
    x._8_8_ = *(undefined8 *)((long)&pVVar1->_vptr_Vector3Float + lVar3);
    Vector3Float::marshal(&x,dataStream);
    Vector3Float::~Vector3Float(&x);
    uVar2 = uVar2 + 1;
    lVar3 = lVar3 + 0x18;
  }
  return;
}

Assistant:

void UaPdu::marshal(DataStream& dataStream) const
{
    DistributedEmissionsFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _emittingEntityID.marshal(dataStream);
    _eventID.marshal(dataStream);
    dataStream << _stateChangeIndicator;
    dataStream << _pad;
    dataStream << _passiveParameterIndex;
    dataStream << _propulsionPlantConfiguration;
    dataStream << ( unsigned char )_shaftRPMs.size();
    dataStream << ( unsigned char )_apaData.size();
    dataStream << ( unsigned char )_emitterSystems.size();

     for(size_t idx = 0; idx < _shaftRPMs.size(); idx++)
     {
        Vector3Float x = _shaftRPMs[idx];
        x.marshal(dataStream);
     }


     for(size_t idx = 0; idx < _apaData.size(); idx++)
     {
        Vector3Float x = _apaData[idx];
        x.marshal(dataStream);
     }


     for(size_t idx = 0; idx < _emitterSystems.size(); idx++)
     {
        Vector3Float x = _emitterSystems[idx];
        x.marshal(dataStream);
     }

}